

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall asl::LocalSocket_::bind(LocalSocket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *__name;
  sockaddr *__addr_00;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_30 [8];
  InetAddress here;
  String *name_local;
  LocalSocket_ *this_local;
  
  here._8_8_ = CONCAT44(in_register_00000034,__fd);
  __name = asl::String::operator_cast_to_char_((String *)here._8_8_);
  unlink(__name);
  Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  InetAddress::InetAddress((InetAddress *)local_30,(String *)here._8_8_);
  iVar1 = *(int *)&(this->super_Socket_).super_SmartObject_.field_0xc;
  __addr_00 = (sockaddr *)InetAddress::ptr((InetAddress *)local_30);
  iVar1 = ::bind(iVar1,__addr_00,0x6e);
  if (iVar1 != 0) {
    (this->super_Socket_)._error = 8;
  }
  InetAddress::~InetAddress((InetAddress *)local_30);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar1 == 0);
}

Assistant:

bool LocalSocket_::bind(const String& name)
{
#ifdef ASL_SOCKET_LOCAL
#ifdef _WIN32
	DeleteFileW(name);
#else
	unlink(name);
#endif
	init();
	InetAddress here(name);
	if (::bind(_handle, (sockaddr*)here.ptr(), sizeof(sockaddr_un)))
	{
		_error = SOCKET_BAD_BIND;
		return false;
	}
	return true;
#else
	asl_error("Unix sockets not supported");
	_error = SOCKET_BAD_BIND;
	return false;
#endif
}